

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

ParserResult * __thiscall
Catch::clara::detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/discretedynamics[P]cyclone/build_O3/_deps/catch2-src/single_include/catch2/catch.hpp:9743:35)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_discretedynamics[P]cyclone_build_O3__deps_catch2_src_single_include_catch2_catch_hpp:9743:35)>
          *this,string *arg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__s2;
  size_type __n;
  int iVar1;
  InWhatOrder IVar2;
  long *plVar3;
  size_type *psVar4;
  size_t __len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  string local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  BoundLambda<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_discretedynamics[P]cyclone_build_O3__deps_catch2_src_single_include_catch2_catch_hpp:9743:35)>
  *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined **local_60;
  undefined8 local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_88 = this;
  ::std::__cxx11::string::_M_assign((string *)&local_a8);
  __n = local_a8._M_string_length;
  local_58 = 0;
  local_60 = &PTR__BasicResult_001986b8;
  local_48 = 0;
  local_40 = 0;
  __s2 = &local_d0.field_2;
  local_d0.field_2._M_allocated_capacity = 0x646572616c636564;
  local_d0._M_string_length = 8;
  local_d0.field_2._8_8_ = local_d0.field_2._8_8_ & 0xffffffffffffff00;
  local_d0._M_dataplus._M_p = (pointer)__s2;
  local_50 = &local_40;
  if (8 < local_a8._M_string_length) goto LAB_0013c409;
  if (local_a8._M_string_length == 0) {
LAB_0013c510:
    IVar2 = InDeclarationOrder;
  }
  else {
    local_b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_a8._M_dataplus._M_p;
    iVar1 = bcmp(local_a8._M_dataplus._M_p,__s2,local_a8._M_string_length);
    if (iVar1 == 0) goto LAB_0013c510;
    local_d0._M_string_length = 7;
    local_d0.field_2._M_allocated_capacity = 0x6c61636978656c;
    local_d0._M_dataplus._M_p = (pointer)__s2;
    if (__n == 8) {
LAB_0013c409:
      ::std::operator+(&local_80,"Unrecognised ordering: \'",&local_a8);
      plVar3 = (long *)::std::__cxx11::string::append((char *)&local_80);
      psVar4 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_d0.field_2._M_allocated_capacity = *psVar4;
        local_d0.field_2._8_8_ = plVar3[3];
        local_d0._M_dataplus._M_p = (pointer)__s2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar4;
        local_d0._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_d0._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      BasicResult<Catch::clara::detail::ParseResultType>::BasicResult
                (__return_storage_ptr__,RuntimeError,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != __s2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      local_60 = &PTR__BasicResult_001986b8;
      if (local_50 != &local_40) {
        operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      }
      goto LAB_0013c5c0;
    }
    iVar1 = bcmp(local_b0,__s2,__n);
    if (iVar1 != 0) {
      local_d0._M_string_length = 6;
      local_d0.field_2._M_allocated_capacity._0_7_ = 0x6d6f646e6172;
      local_d0._M_dataplus._M_p = (pointer)__s2;
      if (__n < 7) {
        iVar1 = bcmp(local_b0,__s2,__n);
        if (iVar1 == 0) {
          IVar2 = InRandomOrder;
          goto LAB_0013c512;
        }
      }
      goto LAB_0013c409;
    }
    IVar2 = InLexicographicalOrder;
  }
LAB_0013c512:
  ((local_88->m_lambda).config)->runOrder = IVar2;
  *(undefined8 *)
   &(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase.m_type = 0;
  (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
  super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001986b8;
  (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
  (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
  (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
LAB_0013c5c0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                             local_a8.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const &arg ) -> ParserResult override {
            return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>( m_lambda, arg );
        }